

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfsfileengine.cpp
# Opt level: O2

qint64 __thiscall QFSFileEnginePrivate::sizeFdFh(QFSFileEnginePrivate *this)

{
  byte *pbVar1;
  bool bVar2;
  qint64 qVar3;
  
  (*((this->super_QAbstractFileEnginePrivate).q_ptr)->_vptr_QAbstractFileEngine[4])();
  this->field_0xc2 = this->field_0xc2 & 0xfb;
  pbVar1 = (byte *)((long)&(this->metaData).knownFlagsMask.
                           super_QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>.
                           super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i + 2);
  *pbVar1 = *pbVar1 & 0xdf;
  bVar2 = doStat(this,(MetaDataFlags)0x200000);
  if (bVar2) {
    qVar3 = (this->metaData).size_;
  }
  else {
    qVar3 = 0;
  }
  return qVar3;
}

Assistant:

qint64 QFSFileEnginePrivate::sizeFdFh() const
{
    Q_Q(const QFSFileEngine);
    const_cast<QFSFileEngine *>(q)->flush();

    tried_stat = 0;
    metaData.clearFlags(QFileSystemMetaData::SizeAttribute);
    if (!doStat(QFileSystemMetaData::SizeAttribute))
        return 0;
    return metaData.size();
}